

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Souperify.cpp
# Opt level: O1

void __thiscall
wasm::DataFlow::UseFinder::addSetUses
          (UseFinder *this,LocalSet *set,Graph *graph,LocalGraph *localGraph,
          vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *ret)

{
  pointer *pppEVar1;
  LocalSet *get;
  ulong uVar2;
  LocalSet *set_00;
  LocalSet *pLVar3;
  iterator __position;
  int iVar4;
  SetInfluences *pSVar5;
  ostream *poVar6;
  GetInfluences *pGVar7;
  Expression *pEVar8;
  long lVar9;
  char *pcVar10;
  _Hash_node_base *p_Var11;
  pair<std::__detail::_Node_iterator<wasm::LocalSet_*,_true,_false>,_bool> pVar12;
  LocalSet *local_48;
  LocalSet *set_local;
  Expression *value;
  
  local_48 = set;
  pVar12 = std::
           _Hashtable<wasm::LocalSet*,wasm::LocalSet*,std::allocator<wasm::LocalSet*>,std::__detail::_Identity,std::equal_to<wasm::LocalSet*>,std::hash<wasm::LocalSet*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
           ::_M_emplace<wasm::LocalSet*&>
                     ((_Hashtable<wasm::LocalSet*,wasm::LocalSet*,std::allocator<wasm::LocalSet*>,std::__detail::_Identity,std::equal_to<wasm::LocalSet*>,std::hash<wasm::LocalSet*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                       *)this,&local_48);
  if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pSVar5 = LocalGraph::getSetInfluences(localGraph,local_48);
    iVar4 = debug();
    if (1 < iVar4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"addSetUses for ",0xf);
      poVar6 = std::ostream::_M_insert<void_const*>(&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," gets\n",6);
    }
    for (p_Var11 = (pSVar5->_M_h)._M_before_begin._M_nxt; p_Var11 != (_Hash_node_base *)0x0;
        p_Var11 = p_Var11->_M_nxt) {
      get = (LocalSet *)p_Var11[1]._M_nxt;
      pGVar7 = LocalGraph::getGetInfluences(localGraph,(LocalGet *)get);
      uVar2 = (pGVar7->_M_h)._M_element_count;
      if (1 < uVar2) {
        __assert_fail("sets.size() <= 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Souperify.cpp"
                      ,0x67,
                      "void wasm::DataFlow::UseFinder::addSetUses(LocalSet *, Graph &, LocalGraph &, std::vector<Expression *> &)"
                     );
      }
      if (uVar2 == 0) {
        pEVar8 = Graph::getParent(graph,(Expression *)get);
        if ((pEVar8 == (Expression *)0x0) || (pEVar8->_id != DropId)) {
          set_local = (LocalSet *)0x0;
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          emplace_back<wasm::Expression*>
                    ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)ret,
                     (Expression **)&set_local);
          iVar4 = debug();
          if (1 < iVar4) {
            lVar9 = 0xc;
            poVar6 = (ostream *)&std::cout;
            pcVar10 = "add nullptr\n";
            goto LAB_00b4e2eb;
          }
        }
      }
      else {
        set_00 = (LocalSet *)(pGVar7->_M_h)._M_before_begin._M_nxt[1]._M_nxt;
        pLVar3 = (LocalSet *)set_00->value;
        if (pLVar3 == get) {
          addSetUses(this,set_00,graph,localGraph,ret);
        }
        else {
          __position._M_current =
               (ret->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>).
               _M_impl.super__Vector_impl_data._M_finish;
          set_local = pLVar3;
          if (__position._M_current ==
              (ret->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            _M_realloc_insert<wasm::Expression*const&>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)ret,__position
                       ,(Expression **)&set_local);
          }
          else {
            *__position._M_current = (Expression *)pLVar3;
            pppEVar1 = &(ret->
                        super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)
                        ._M_impl.super__Vector_impl_data._M_finish;
            *pppEVar1 = *pppEVar1 + 1;
          }
          iVar4 = debug();
          if (1 < iVar4) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"add a value\n",0xc);
            poVar6 = std::ostream::_M_insert<void_const*>(&std::cout);
            value._7_1_ = 10;
            lVar9 = 1;
            pcVar10 = (char *)((long)&value + 7);
LAB_00b4e2eb:
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar10,lVar9);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void addSetUses(LocalSet* set,
                  Graph& graph,
                  LocalGraph& localGraph,
                  std::vector<Expression*>& ret) {
    // If already handled, nothing to do here.
    if (!seenSets.emplace(set).second) {
      return;
    }
    // Find all the uses of that set.
    auto& gets = localGraph.getSetInfluences(set);
    if (debug() >= 2) {
      std::cout << "addSetUses for " << set << ", " << gets.size() << " gets\n";
    }
    for (auto* get : gets) {
      // Each of these relevant gets is either
      //  (1) a child of a set, which we can track, or
      //  (2) not a child of a set, e.g., a call argument or such
      auto& sets = localGraph.getGetInfluences(get); // TODO: iterator
      // In flat IR, each get can influence at most 1 set.
      assert(sets.size() <= 1);
      if (sets.size() == 0) {
        // This get is not the child of a set. Check if it is a drop,
        // otherwise it is an actual use, and so an external use.
        auto* parent = graph.getParent(get);
        if (parent && parent->is<Drop>()) {
          // Just ignore it.
        } else {
          ret.push_back(nullptr);
          if (debug() >= 2) {
            std::cout << "add nullptr\n";
          }
        }
      } else {
        // This get is the child of a set.
        auto* subSet = *sets.begin();
        // If this is a copy, we need to look through it: data-flow IR
        // counts actual values, not copies, and in particular we need
        // to look through the copies that implement a phi.
        if (subSet->value == get) {
          // Indeed a copy.
          // TODO: this could be optimized and done all at once beforehand.
          addSetUses(subSet, graph, localGraph, ret);
        } else {
          // Not a copy.
          auto* value = subSet->value;
          ret.push_back(value);
          if (debug() >= 2) {
            std::cout << "add a value\n" << value << '\n';
          }
        }
      }
    }
  }